

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int archive_read_format_rar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  void *pvVar1;
  int local_3c;
  int ret;
  rar *rar;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  if (*(int *)((long)pvVar1 + 0x4ee8) == -1) {
    *(undefined4 *)((long)pvVar1 + 0x4ee8) = 0;
  }
  if (0 < *(long *)((long)pvVar1 + 0x98)) {
    __archive_read_consume(a,*(int64_t *)((long)pvVar1 + 0x98));
    *(undefined8 *)((long)pvVar1 + 0x98) = 0;
  }
  if ((*(char *)((long)pvVar1 + 0xe5) == '\0') &&
     (*(long *)((long)pvVar1 + 0xc0) < *(long *)((long)pvVar1 + 0x28))) {
    if (*(char *)((long)pvVar1 + 0x17) == 0x30) {
      local_3c = read_data_stored(a,buff,size,offset);
    }
    else if ((int)*(char *)((long)pvVar1 + 0x17) - 0x31U < 5) {
      local_3c = read_data_compressed(a,buff,size,offset);
      if ((local_3c != 0) && (local_3c != -0x14)) {
        Ppmd7_Free((CPpmd7 *)((long)pvVar1 + 0x370),&g_szalloc);
      }
    }
    else {
      archive_set_error(&a->archive,0x54,"Unsupported compression method for RAR file.");
      local_3c = -0x1e;
    }
    a_local._4_4_ = local_3c;
  }
  else {
    *buff = (void *)0x0;
    *size = 0;
    *offset = *(int64_t *)((long)pvVar1 + 0xb0);
    if (*offset < *(long *)((long)pvVar1 + 0x28)) {
      *offset = *(int64_t *)((long)pvVar1 + 0x28);
    }
    a_local._4_4_ = 1;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_rar_read_data(struct archive_read *a, const void **buff,
                                  size_t *size, int64_t *offset)
{
  struct rar *rar = (struct rar *)(a->format->data);
  int ret;

  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  if (rar->bytes_unconsumed > 0) {
      /* Consume as much as the decompressor actually used. */
      __archive_read_consume(a, rar->bytes_unconsumed);
      rar->bytes_unconsumed = 0;
  }

  if (rar->entry_eof || rar->offset_seek >= rar->unp_size) {
    *buff = NULL;
    *size = 0;
    *offset = rar->offset;
    if (*offset < rar->unp_size)
      *offset = rar->unp_size;
    return (ARCHIVE_EOF);
  }

  switch (rar->compression_method)
  {
  case COMPRESS_METHOD_STORE:
    ret = read_data_stored(a, buff, size, offset);
    break;

  case COMPRESS_METHOD_FASTEST:
  case COMPRESS_METHOD_FAST:
  case COMPRESS_METHOD_NORMAL:
  case COMPRESS_METHOD_GOOD:
  case COMPRESS_METHOD_BEST:
    ret = read_data_compressed(a, buff, size, offset);
    if (ret != ARCHIVE_OK && ret != ARCHIVE_WARN)
      __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unsupported compression method for RAR file.");
    ret = ARCHIVE_FATAL;
    break;
  }
  return (ret);
}